

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

int __thiscall testing::internal::ForkingDeathTest::Wait(ForkingDeathTest *this)

{
  __pid_t _Var1;
  int iVar2;
  int *piVar3;
  long *plVar4;
  long *plVar5;
  size_type *psVar6;
  int status_value;
  int local_13c;
  string local_138;
  int local_114;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  string local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar2 = 0;
  if ((this->super_DeathTestImpl).spawned_ == true) {
    DeathTestImpl::ReadAndInterpretStatusByte(&this->super_DeathTestImpl);
    while( true ) {
      _Var1 = waitpid(*(__pid_t *)&(this->super_DeathTestImpl).field_0x3c,&local_13c,0);
      if (_Var1 != -1) break;
      piVar3 = __errno_location();
      if (*piVar3 != 4) {
        local_70[0] = local_60;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"CHECK failed: File ","")
        ;
        plVar4 = (long *)std::__cxx11::string::append((char *)local_70);
        local_f0 = (long *)*plVar4;
        plVar5 = plVar4 + 2;
        if (local_f0 == plVar5) {
          local_e0 = *plVar5;
          lStack_d8 = plVar4[3];
          local_f0 = &local_e0;
        }
        else {
          local_e0 = *plVar5;
        }
        local_e8 = plVar4[1];
        *plVar4 = (long)plVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_f0);
        local_110._M_dataplus._M_p = (pointer)*plVar4;
        psVar6 = (size_type *)(plVar4 + 2);
        if ((size_type *)local_110._M_dataplus._M_p == psVar6) {
          local_110.field_2._M_allocated_capacity = *psVar6;
          local_110.field_2._8_8_ = plVar4[3];
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        }
        else {
          local_110.field_2._M_allocated_capacity = *psVar6;
        }
        local_110._M_string_length = plVar4[1];
        *plVar4 = (long)psVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        local_114 = 0x43d;
        StreamableToString<int>(&local_90,&local_114);
        std::operator+(&local_50,&local_110,&local_90);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_d0 = (long *)*plVar4;
        plVar5 = plVar4 + 2;
        if (local_d0 == plVar5) {
          local_c0 = *plVar5;
          lStack_b8 = plVar4[3];
          local_d0 = &local_c0;
        }
        else {
          local_c0 = *plVar5;
        }
        local_c8 = plVar4[1];
        *plVar4 = (long)plVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_d0);
        local_b0 = (long *)*plVar4;
        plVar5 = plVar4 + 2;
        if (local_b0 == plVar5) {
          local_a0 = *plVar5;
          lStack_98 = plVar4[3];
          local_b0 = &local_a0;
        }
        else {
          local_a0 = *plVar5;
        }
        local_a8 = plVar4[1];
        *plVar4 = (long)plVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
        local_138._M_dataplus._M_p = (pointer)*plVar4;
        psVar6 = (size_type *)(plVar4 + 2);
        if ((size_type *)local_138._M_dataplus._M_p == psVar6) {
          local_138.field_2._M_allocated_capacity = *psVar6;
          local_138.field_2._8_8_ = plVar4[3];
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        }
        else {
          local_138.field_2._M_allocated_capacity = *psVar6;
        }
        local_138._M_string_length = plVar4[1];
        *plVar4 = (long)psVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        DeathTestAbort(&local_138);
      }
    }
    (this->super_DeathTestImpl).status_ = local_13c;
    iVar2 = local_13c;
  }
  return iVar2;
}

Assistant:

int ForkingDeathTest::Wait() {
  if (!spawned()) return 0;

  ReadAndInterpretStatusByte();

  int status_value;
  GTEST_DEATH_TEST_CHECK_SYSCALL_(waitpid(child_pid_, &status_value, 0));
  set_status(status_value);
  return status_value;
}